

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::uniform_matrixfv_invalid_location
               (NegativeTestContext *ctx)

{
  undefined *puVar1;
  deUint64 dVar2;
  deUint32 dVar3;
  RenderContext *renderCtx;
  reference pvVar4;
  allocator<char> local_251;
  string local_250;
  allocator<float> local_229;
  undefined1 local_228 [8];
  vector<float,_std::allocator<float>_> data;
  string local_208;
  allocator<char> local_1d1;
  string local_1d0;
  ProgramSources local_1b0;
  undefined1 local_e0 [8];
  ShaderProgram program;
  NegativeTestContext *ctx_local;
  
  program.m_program.m_info.linkTimeUs = (deUint64)ctx;
  renderCtx = NegativeTestContext::getRenderContext(ctx);
  puVar1 = uniformTestVertSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1d0,puVar1,&local_1d1);
  puVar1 = uniformTestFragSource;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,puVar1,
             (allocator<char> *)
             ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  glu::makeVtxFragSources(&local_1b0,&local_1d0,&local_208);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)local_e0,renderCtx,&local_1b0);
  glu::ProgramSources::~ProgramSources(&local_1b0);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&data.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_1d0);
  std::allocator<char>::~allocator(&local_1d1);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  std::allocator<float>::allocator(&local_229);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)local_228,0x10,&local_229);
  std::allocator<float>::~allocator(&local_229);
  dVar2 = program.m_program.m_info.linkTimeUs;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_250,
             "GL_INVALID_OPERATION is generated if location is an invalid uniform location for the current program object and location is not equal to -1."
             ,&local_251);
  NegativeTestContext::beginSection((NegativeTestContext *)dVar2,&local_250);
  std::__cxx11::string::~string((string *)&local_250);
  std::allocator<char>::~allocator(&local_251);
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix2fv((CallLogWrapper *)dVar2,-2,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix3fv((CallLogWrapper *)dVar2,-2,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix4fv((CallLogWrapper *)dVar2,-2,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix2x3fv((CallLogWrapper *)dVar2,-2,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix3x2fv((CallLogWrapper *)dVar2,-2,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix2x4fv((CallLogWrapper *)dVar2,-2,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix4x2fv((CallLogWrapper *)dVar2,-2,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix3x4fv((CallLogWrapper *)dVar2,-2,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix4x3fv((CallLogWrapper *)dVar2,-2,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0x502)
  ;
  dVar2 = program.m_program.m_info.linkTimeUs;
  dVar3 = glu::ShaderProgram::getProgram((ShaderProgram *)local_e0);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)dVar2,dVar3);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix2fv((CallLogWrapper *)dVar2,-1,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix3fv((CallLogWrapper *)dVar2,-1,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix4fv((CallLogWrapper *)dVar2,-1,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix2x3fv((CallLogWrapper *)dVar2,-1,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix3x2fv((CallLogWrapper *)dVar2,-1,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix2x4fv((CallLogWrapper *)dVar2,-1,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix4x2fv((CallLogWrapper *)dVar2,-1,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix3x4fv((CallLogWrapper *)dVar2,-1,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  dVar2 = program.m_program.m_info.linkTimeUs;
  pvVar4 = std::vector<float,_std::allocator<float>_>::operator[]
                     ((vector<float,_std::allocator<float>_> *)local_228,0);
  glu::CallLogWrapper::glUniformMatrix4x3fv((CallLogWrapper *)dVar2,-1,1,'\0',pvVar4);
  NegativeTestContext::expectError((NegativeTestContext *)program.m_program.m_info.linkTimeUs,0);
  NegativeTestContext::endSection((NegativeTestContext *)program.m_program.m_info.linkTimeUs);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)program.m_program.m_info.linkTimeUs,0);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)local_228);
  glu::ShaderProgram::~ShaderProgram((ShaderProgram *)local_e0);
  return;
}

Assistant:

void uniform_matrixfv_invalid_location (NegativeTestContext& ctx)
{
	glu::ShaderProgram program(ctx.getRenderContext(), glu::makeVtxFragSources(uniformTestVertSource, uniformTestFragSource));

	ctx.glUseProgram(program.getProgram());
	ctx.expectError(GL_NO_ERROR);

	std::vector<GLfloat> data(16);

	ctx.beginSection("GL_INVALID_OPERATION is generated if location is an invalid uniform location for the current program object and location is not equal to -1.");
	ctx.glUseProgram(program.getProgram());
	ctx.glUniformMatrix2fv(-2, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3fv(-2, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4fv(-2, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glUniformMatrix2x3fv(-2, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x2fv(-2, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix2x4fv(-2, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x2fv(-2, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix3x4fv(-2, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniformMatrix4x3fv(-2, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_INVALID_OPERATION);

	ctx.glUseProgram(program.getProgram());
	ctx.glUniformMatrix2fv(-1, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniformMatrix3fv(-1, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniformMatrix4fv(-1, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);

	ctx.glUniformMatrix2x3fv(-1, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniformMatrix3x2fv(-1, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniformMatrix2x4fv(-1, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniformMatrix4x2fv(-1, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniformMatrix3x4fv(-1, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.glUniformMatrix4x3fv(-1, 1, GL_FALSE, &data[0]);
	ctx.expectError(GL_NO_ERROR);
	ctx.endSection();

	ctx.glUseProgram(0);
}